

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLoggerMgr::logStackBackTraceOtherThreads(SimpleLoggerMgr *this)

{
  ulong __val;
  _Hash_node_base *__threadid;
  char cVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  pthread_t pVar5;
  long *plVar6;
  ulong uVar7;
  __sighandler_t p_Var8;
  _Hash_node_base *p_Var9;
  pthread_t tid;
  bool bVar10;
  string msg_1;
  string msg;
  string __str;
  string local_168;
  _union_1457 local_148;
  sigset_t local_140;
  undefined4 local_c0;
  sigset_t local_b0;
  
  if (this->crashDumpOriginOnly == false) {
    pVar5 = pthread_self();
    LOCK();
    bVar10 = (this->crashOriginThread).super___atomic_base<unsigned_long>._M_i == 0;
    if (bVar10) {
      (this->crashOriginThread).super___atomic_base<unsigned_long>._M_i = pVar5;
    }
    UNLOCK();
    if (bVar10) {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->activeThreadsLock);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"captured ","");
      __val = (this->activeThreads)._M_h._M_element_count;
      cVar2 = '\x01';
      if (9 < __val) {
        uVar7 = __val;
        cVar1 = '\x04';
        do {
          cVar2 = cVar1;
          if (uVar7 < 100) {
            cVar2 = cVar2 + -2;
            goto LAB_001837f5;
          }
          if (uVar7 < 1000) {
            cVar2 = cVar2 + -1;
            goto LAB_001837f5;
          }
          if (uVar7 < 10000) goto LAB_001837f5;
          bVar10 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar1 = cVar2 + '\x04';
        } while (bVar10);
        cVar2 = cVar2 + '\x01';
      }
LAB_001837f5:
      local_b0.__val[0] = (ulong)(local_b0.__val + 2);
      std::__cxx11::string::_M_construct((ulong)&local_b0,cVar2);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_b0.__val[0],(uint)local_b0.__val[1],__val);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      p_Var8 = (__sighandler_t)(plVar6 + 2);
      if ((__sighandler_t)*plVar6 == p_Var8) {
        local_140.__val[1] = *(ulong *)p_Var8;
        local_140.__val[2] = plVar6[3];
        local_148.sa_handler = (__sighandler_t)(local_140.__val + 1);
      }
      else {
        local_140.__val[1] = *(ulong *)p_Var8;
        local_148.sa_handler = (__sighandler_t)*plVar6;
      }
      local_140.__val[0] = plVar6[1];
      *plVar6 = (long)p_Var8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_148);
      if (local_148.sa_handler != (__sighandler_t)(local_140.__val + 1)) {
        operator_delete(local_148.sa_handler);
      }
      if ((ulong *)local_b0.__val[0] != local_b0.__val + 2) {
        operator_delete((void *)local_b0.__val[0]);
      }
      flushAllLoggers(this,2,&local_168);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->crashDumpFile,local_168._M_dataplus._M_p,
                            local_168._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
      }
      p_Var9 = (this->activeThreads)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        do {
          __threadid = p_Var9[1]._M_nxt;
          if (__threadid !=
              (_Hash_node_base *)(this->crashOriginThread).super___atomic_base<unsigned_long>._M_i)
          {
            sigfillset(&local_140);
            local_c0 = 4;
            local_148.sa_handler = handleStackTrace;
            sigaction(0xc,(sigaction *)&local_148,(sigaction *)0x0);
            pthread_kill((pthread_t)__threadid,0xc);
            sigfillset(&local_b0);
            sigdelset(&local_b0,0xc);
            sigsuspend(&local_b0);
          }
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_168,0,(char *)local_168._M_string_length,0x46afb4);
      flushAllLoggers(this,2,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->activeThreadsLock);
    }
  }
  else {
    local_148.sa_handler = (__sighandler_t)(local_140.__val + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"will not explore other threads (disabled by user)","");
    flushAllLoggers(this,2,(string *)&local_148);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->crashDumpFile,(char *)local_148.sa_handler,
                          local_140.__val[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
    }
    if (local_148.sa_handler != (__sighandler_t)(local_140.__val + 1)) {
      operator_delete(local_148.sa_handler);
    }
  }
  return;
}

Assistant:

void SimpleLoggerMgr::logStackBackTraceOtherThreads() {
    bool got_other_stacks = false;
#ifdef __linux__
    if (!crashDumpOriginOnly) {
        // Not support non-Linux platform.
        uint64_t my_tid = pthread_self();
        uint64_t exp = 0;
        if (!crashOriginThread.compare_exchange_strong(exp, my_tid)) {
            // Other thread is already working on it, stop here.
            return;
        }

        std::lock_guard<std::mutex> l(activeThreadsLock);
        std::string msg = "captured ";
        msg += std::to_string(activeThreads.size()) + " active threads";
        flushAllLoggers(2, msg);
        if (crashDumpFile.is_open()) crashDumpFile << msg << "\n\n";

        for (uint64_t _tid: activeThreads) {
            pthread_t tid = (pthread_t)_tid;
            if (_tid == crashOriginThread) continue;

            struct sigaction _action;
            sigfillset(&_action.sa_mask);
            _action.sa_flags = SA_SIGINFO;
            _action.sa_sigaction = SimpleLoggerMgr::handleStackTrace;
            sigaction(SIGUSR2, &_action, NULL);

            pthread_kill(tid, SIGUSR2);

            sigset_t _mask;
            sigfillset(&_mask);
            sigdelset(&_mask, SIGUSR2);
            sigsuspend(&_mask);
        }

        msg = "got all stack traces, now flushing them";
        flushAllLoggers(2, msg);

        got_other_stacks = true;
    }
#endif

    if (!got_other_stacks) {
        std::string msg = "will not explore other threads (disabled by user)";
        flushAllLoggers(2, msg);
        if (crashDumpFile.is_open()) {
            crashDumpFile << msg << "\n\n";
        }
    }
}